

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void write_vector_int<QPDF::HPageOffsetEntry,long_long>
               (BitWriter *w,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,int bits
               ,offset_in_HPageOffsetEntry_to_long_long field)

{
  unsigned_long uVar1;
  reference pvVar2;
  unsigned_long_long val;
  size_t i;
  ulong __n;
  int local_38;
  int local_34;
  
  _local_38 = CONCAT44(nitems,bits);
  __n = 0;
  while( true ) {
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_34);
    if (uVar1 <= __n) break;
    pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (vec,__n);
    val = QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::convert
                    ((longlong *)((long)&pvVar2->delta_nobjects + field));
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_38);
    BitWriter::writeBits(w,val,uVar1);
    __n = __n + 1;
  }
  BitWriter::flush(w);
  return;
}

Assistant:

static void
write_vector_int(BitWriter& w, int nitems, std::vector<T>& vec, int bits, int_type T::* field)
{
    // nitems times, write bits bits from the given field of the ith vector to the given bit writer.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        w.writeBits(QIntC::to_ulonglong(vec.at(i).*field), QIntC::to_size(bits));
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    w.flush();
}